

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.c
# Opt level: O0

int open_datafile(char *filename,int oflags,int prefix)

{
  char *__file;
  int iVar1;
  int fd;
  int prefix_local;
  int oflags_local;
  char *filename_local;
  
  iVar1 = 0;
  if (prefix == 4) {
    iVar1 = 3;
  }
  __file = fqname(filename,prefix,iVar1);
  iVar1 = open(__file,oflags,0x1a4);
  fchmod(iVar1,0x1a4);
  return iVar1;
}

Assistant:

int open_datafile(const char *filename, int oflags, int prefix)
{
	int fd;
#ifdef WIN32
	oflags |= O_BINARY;
#endif

	filename = fqname(filename, prefix, prefix == TROUBLEPREFIX ? 3 : 0);
#ifdef WIN32
	fd = open(filename, oflags, S_IRUSR | S_IWUSR);
#else
	fd = open(filename, oflags, S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH);
#endif
#ifdef UNIX
	/* bypass umask and set 0644 for real */
	fchmod(fd, 0644);
#endif
	return fd;
}